

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O2

void __thiscall
QMdi::ControlElement<QMdi::ControlLabel>::ControlElement
          (ControlElement<QMdi::ControlLabel> *this,QMdiSubWindow *child)

{
  ControlLabel::ControlLabel(&this->super_ControlLabel,(QWidget *)0x0);
  *(undefined ***)&(this->super_ControlLabel).super_QWidget = &PTR_metaObject_007d0a80;
  *(undefined ***)&(this->super_ControlLabel).super_QWidget.super_QPaintDevice =
       &PTR__ControlElement_007d0c30;
  (this->mdiChild).wp.d = (Data *)0x0;
  (this->mdiChild).wp.value = (QObject *)0x0;
  QWeakPointer<QObject>::assign<QObject>(&(this->mdiChild).wp,(QObject *)child);
  return;
}

Assistant:

ControlElement(QMdiSubWindow *child) : T(nullptr)
    {
        Q_ASSERT(child);
        mdiChild = child;
    }